

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CESkyCoord.cpp
# Opt level: O0

CESkyCoord * __thiscall
CESkyCoord::ConvertToCIRS(CESkyCoord *this,CEDate *date,CEObserver *observer)

{
  CEDate *in_RSI;
  CESkyCoord *in_RDI;
  CESkyCoord *unaff_retaddr;
  CESkyCoord *cirs;
  CEDate *in_stack_000000e0;
  CESkyCoord *in_stack_000000e8;
  CESkyCoord *in_stack_000000f0;
  CEObserver *in_stack_000001f8;
  CEDate *in_stack_00000200;
  CESkyCoord *in_stack_00000208;
  CESkyCoord *in_stack_00000210;
  CESkyCoord *in_stack_ffffffffffffffa8;
  CESkyCoord *this_00;
  CESkyCoord *in_stack_ffffffffffffffd0;
  CEDate *date_00;
  CESkyCoord *out_cirs;
  
  this_00 = in_RDI;
  date_00 = in_RSI;
  out_cirs = in_RDI;
  CESkyCoord(in_stack_ffffffffffffffd0);
  if (*(int *)&(in_RSI->gregorian_date_vect_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_finish == 0) {
    SetCoordinates(this_00,in_stack_ffffffffffffffa8);
  }
  else if (*(int *)&(in_RSI->gregorian_date_vect_).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish == 1) {
    ICRS2CIRS(in_stack_000000f0,in_stack_000000e8,in_stack_000000e0);
  }
  else if (*(int *)&(in_RSI->gregorian_date_vect_).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish == 2) {
    Galactic2CIRS(unaff_retaddr,out_cirs,date_00);
  }
  else if (*(int *)&(in_RSI->gregorian_date_vect_).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish == 3) {
    Observed2CIRS(in_stack_00000210,in_stack_00000208,in_stack_00000200,in_stack_000001f8);
  }
  else if (*(int *)&(in_RSI->gregorian_date_vect_).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish == 4) {
    Ecliptic2CIRS(unaff_retaddr,out_cirs,date_00);
  }
  return in_RDI;
}

Assistant:

CESkyCoord CESkyCoord::ConvertToCIRS(const CEDate&     date,
                                     const CEObserver& observer)
{
    // Create the coordinate to be returned
    CESkyCoord cirs;

    // Convert
    if (coord_type_ == CESkyCoordType::CIRS) {
        // CIRS -> CIRS
        cirs.SetCoordinates(*this);
    } else if (coord_type_ == CESkyCoordType::ICRS) {
        // ICRS -> CIRS
        ICRS2CIRS(*this, &cirs, date);
    } else if (coord_type_ == CESkyCoordType::GALACTIC) {
        // Galactic -> CIRS
        Galactic2CIRS(*this, &cirs, date);
    } else if (coord_type_ == CESkyCoordType::OBSERVED) {
        // Observed -> CIRS
        Observed2CIRS(*this, &cirs, date, observer);
    } else if (coord_type_ == CESkyCoordType::ECLIPTIC) {
        // ECLIPTIC -> CIRS
        Ecliptic2CIRS(*this, &cirs, date);
    }
    
    return cirs;
}